

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall
pbrt::BasicSceneBuilder::Camera
          (BasicSceneBuilder *this,string *name,ParsedParameterVector *params,FileLoc loc)

{
  key_type *__k;
  mapped_type *pmVar1;
  long in_RDI;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  CameraSceneEntity *in_stack_00000008;
  CameraSceneEntity *in_stack_00000010;
  CameraTransform cameraTransform;
  TransformSet worldFromCamera;
  TransformSet cameraFromWorld;
  ParameterDictionary dict;
  ParameterDictionary *in_stack_fffffffffffff088;
  CameraTransform *in_stack_fffffffffffff090;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffff098;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffff0a0;
  RGBColorSpace *in_stack_fffffffffffff0c0;
  int i;
  ParsedParameterVector *in_stack_fffffffffffff0c8;
  ParameterDictionary *in_stack_fffffffffffff0d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  TransformSet *in_stack_fffffffffffff120;
  string *in_stack_fffffffffffff160;
  CameraTransform *in_stack_fffffffffffff168;
  ParameterDictionary *in_stack_fffffffffffff170;
  string *in_stack_fffffffffffff178;
  CameraSceneEntity *in_stack_fffffffffffff180;
  FileLoc in_stack_fffffffffffff190;
  undefined1 local_a8c [64];
  undefined1 local_a4c [64];
  Float in_stack_fffffffffffff664;
  Transform *in_stack_fffffffffffff668;
  Float in_stack_fffffffffffff674;
  Transform *in_stack_fffffffffffff678;
  AnimatedTransform *in_stack_fffffffffffff680;
  AnimatedTransform *in_stack_fffffffffffff718;
  CameraTransform *in_stack_fffffffffffff720;
  undefined1 local_419 [33];
  undefined1 local_3f8 [64];
  undefined1 local_3b8 [64];
  undefined1 local_378 [64];
  undefined1 local_338 [64];
  undefined1 local_1f8 [64];
  undefined1 local_1b8 [64];
  undefined1 local_178 [64];
  undefined1 local_138 [64];
  
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(in_stack_fffffffffffff0a0,in_stack_fffffffffffff098);
  ParameterDictionary::ParameterDictionary
            (in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                    *)in_stack_fffffffffffff090);
  if (*(int *)(in_RDI + 0x18) == 1) {
    ErrorExit<char_const(&)[7]>
              ((FileLoc *)in_stack_fffffffffffff0d0,(char *)in_stack_fffffffffffff0c8,
               (char (*) [7])in_stack_fffffffffffff0c0);
  }
  auVar2 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + 800));
  auVar3 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + 0x360));
  auVar4 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + 0x3a0));
  auVar5 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + 0x3e0));
  local_138 = vmovdqu64_avx512f(auVar5);
  local_178 = vmovdqu64_avx512f(auVar4);
  local_1b8 = vmovdqu64_avx512f(auVar3);
  local_1f8 = vmovdqu64_avx512f(auVar2);
  Inverse(in_stack_fffffffffffff120);
  Inverse(in_stack_fffffffffffff120);
  __k = (key_type *)(in_RDI + 0x430);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_419;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)__k,(allocator<char> *)in_stack_fffffffffffff0c0);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>_>_>
                         *)this_00,__k);
  auVar3 = vmovdqu64_avx512f(local_3f8);
  auVar4 = vmovdqu64_avx512f(local_3b8);
  auVar5 = vmovdqu64_avx512f(local_378);
  auVar2 = vmovdqu64_avx512f(local_338);
  auVar2 = vmovdqu64_avx512f(auVar2);
  *(undefined1 (*) [64])pmVar1->t[1].mInv.m = auVar2;
  auVar2 = vmovdqu64_avx512f(auVar5);
  *(undefined1 (*) [64])pmVar1->t[1].m.m = auVar2;
  auVar2 = vmovdqu64_avx512f(auVar4);
  *(undefined1 (*) [64])pmVar1->t[0].mInv.m = auVar2;
  auVar2 = vmovdqu64_avx512f(auVar3);
  *(undefined1 (*) [64])pmVar1->t[0].m.m = auVar2;
  std::__cxx11::string::~string((string *)(local_419 + 1));
  i = (int)((ulong)pmVar1 >> 0x20);
  std::allocator<char>::~allocator((allocator<char> *)local_419);
  TransformSet::operator[]((TransformSet *)__k,i);
  TransformSet::operator[]((TransformSet *)__k,i);
  AnimatedTransform::AnimatedTransform
            (in_stack_fffffffffffff680,in_stack_fffffffffffff678,in_stack_fffffffffffff674,
             in_stack_fffffffffffff668,in_stack_fffffffffffff664);
  CameraTransform::CameraTransform(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
  CameraTransform::RenderFromWorld(in_stack_fffffffffffff090);
  auVar3 = vmovdqu64_avx512f(local_a8c);
  auVar2 = vmovdqu64_avx512f(local_a4c);
  auVar2 = vmovdqu64_avx512f(auVar2);
  *(undefined1 (*) [64])(in_RDI + 0x4a0) = auVar2;
  auVar2 = vmovdqu64_avx512f(auVar3);
  *(undefined1 (*) [64])(in_RDI + 0x460) = auVar2;
  ParameterDictionary::ParameterDictionary
            ((ParameterDictionary *)in_stack_fffffffffffff090,in_stack_fffffffffffff088);
  CameraSceneEntity::CameraSceneEntity
            (in_stack_fffffffffffff180,in_stack_fffffffffffff178,in_stack_fffffffffffff170,
             in_stack_fffffffffffff190,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  CameraSceneEntity::operator=(in_stack_00000010,in_stack_00000008);
  CameraSceneEntity::~CameraSceneEntity(in_stack_00000010);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x845726);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x845733);
  return;
}

Assistant:

void BasicSceneBuilder::Camera(const std::string &name, ParsedParameterVector params,
                               FileLoc loc) {
    ParameterDictionary dict(std::move(params), graphicsState.colorSpace);

    VERIFY_OPTIONS("Camera");

    TransformSet cameraFromWorld = graphicsState.ctm;
    TransformSet worldFromCamera = Inverse(graphicsState.ctm);
    namedCoordinateSystems["camera"] = Inverse(cameraFromWorld);

    CameraTransform cameraTransform(
        AnimatedTransform(worldFromCamera[0], graphicsState.transformStartTime,
                          worldFromCamera[1], graphicsState.transformEndTime));
    renderFromWorld = cameraTransform.RenderFromWorld();

    camera = CameraSceneEntity(name, std::move(dict), loc, cameraTransform,
                               graphicsState.currentOutsideMedium);
}